

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O2

void xx(int line_no,int n,char **ps,char *s,int from,int to,int mem,int not,int error_no)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  OnigRegSet *set;
  int match_pos;
  char buf [1000];
  
  iVar3 = make_regset(line_no,n,ps,&set,from);
  if (iVar3 != 0) {
    return;
  }
  sVar4 = strlen(s);
  iVar3 = onig_regset_search(set,s,s + sVar4,s,s + sVar4,XX_LEAD,0,&match_pos);
  if (iVar3 < 0) {
    if (iVar3 != -1) {
      onig_error_code_to_str(buf,iVar3);
      fprintf(_stderr,"ERROR: %d: %s\n",line_no,buf);
LAB_00102ad1:
      nerror = nerror + 1;
      goto LAB_00102a15;
    }
    if (not != 0) {
      pcVar6 = "OK(N): %d\n";
LAB_001029ee:
      fprintf(_stdout,pcVar6,line_no);
      nsucc = nsucc + 1;
      goto LAB_00102a15;
    }
    pcVar6 = "FAIL: %d\n";
LAB_00102a06:
    fprintf(_stdout,pcVar6,line_no);
  }
  else {
    if (not != 0) {
      pcVar6 = "FAIL(N): %d\n";
      goto LAB_00102a06;
    }
    lVar5 = onig_regset_get_region(set,iVar3);
    if (lVar5 == 0) {
      fprintf(_stderr,"ERROR: %d: can\'t get region.\n",line_no);
      goto LAB_00102ad1;
    }
    uVar1 = *(uint *)(*(long *)(lVar5 + 8) + (ulong)(uint)mem * 4);
    uVar2 = *(uint *)(*(long *)(lVar5 + 0x10) + (ulong)(uint)mem * 4);
    if (uVar2 == to && uVar1 == from) {
      pcVar6 = "OK: %d\n";
      goto LAB_001029ee;
    }
    strncpy(buf,s + (int)uVar1,(long)(int)(uVar2 - uVar1));
    buf[(int)(uVar2 - uVar1)] = '\0';
    fprintf(_stdout,"FAIL: %d: %d-%d : %d-%d (%s)\n",line_no,(ulong)(uint)from,(ulong)(uint)to,
            (ulong)uVar1,(ulong)uVar2,buf);
  }
  nfail = nfail + 1;
LAB_00102a15:
  onig_regset_free(set);
  return;
}

Assistant:

static void
xx(int line_no, int n, char* ps[], char* s, int from, int to, int mem, int not, int error_no)
{
  int r;
  int match_pos;
  int match_index;
  OnigRegSet* set;
  char *end;

  r = make_regset(line_no, n, ps, &set, error_no);
  if (r != 0) return ;

  end = s + strlen(s);

  r = onig_regset_search(set, (UChar* )s, (UChar* )end, (UChar* )s, (UChar* )end,
                         XX_LEAD, ONIG_OPTION_NONE, &match_pos);
  if (r < 0) {
    if (r == ONIG_MISMATCH) {
      if (not) {
        fprintf(stdout, "OK(N): %d\n", line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL: %d\n", line_no);
        nfail++;
      }
    }
    else {
      if (error_no == 0) {
        char buf[ONIG_MAX_ERROR_MESSAGE_LEN];
        onig_error_code_to_str((UChar* )buf, r);
        fprintf(stderr, "ERROR: %d: %s\n", line_no, buf);
        nerror++;
      }
      else {
        if (r == error_no) {
          fprintf(stdout, "OK(ERROR): %d: %d\n", line_no, r);
          nsucc++;
        }
        else {
          fprintf(stdout, "FAIL ERROR NO: %d: %d, %d\n", line_no, error_no, r);
          nfail++;
        }
      }
    }
  }
  else {
    if (not) {
      fprintf(stdout, "FAIL(N): %d\n", line_no);
      nfail++;
    }
    else {
      OnigRegion* region;

      match_index = r;
      region = onig_regset_get_region(set, match_index);
      if (region == 0) {
        fprintf(stderr, "ERROR: %d: can't get region.\n", line_no);
        nerror++;
        onig_regset_free(set);
        return ;
      }

      if (region->beg[mem] == from && region->end[mem] == to) {
        fprintf(stdout, "OK: %d\n", line_no);
        nsucc++;
      }
      else {
        char buf[1000];
        int len;
        len = region->end[mem] - region->beg[mem];
        strncpy(buf, s + region->beg[mem], len);
        buf[len] = '\0';
        fprintf(stdout, "FAIL: %d: %d-%d : %d-%d (%s)\n", line_no,
                from, to, region->beg[mem], region->end[mem], buf);
        nfail++;
      }
    }
  }

  onig_regset_free(set);
}